

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_tools.cxx
# Opt level: O3

void __thiscall db_packer::process_folder(db_packer *this,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char cVar3;
  path *ppVar4;
  recursive_directory_iterator __begin1;
  recursive_directory_iterator __end1;
  path fullpath;
  recursive_directory_iterator local_c8;
  recursive_directory_iterator local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  recursive_directory_iterator local_88;
  recursive_directory_iterator local_78;
  recursive_directory_iterator local_60;
  path local_50;
  
  std::operator+(&local_a8,&this->m_root,path);
  std::filesystem::__cxx11::path::path(&local_50,&local_a8,auto_format);
  paVar1 = &local_a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  cVar3 = std::filesystem::status(&local_50);
  if ((cVar3 != '\0') && (cVar3 != -1)) {
    cVar3 = std::filesystem::status(&local_50);
    if (cVar3 == '\x02') {
      std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
                (&local_c8,&local_50,none,(error_code *)0x0);
      if (local_c8._M_dirs._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      {
        local_b8._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_b8._M_dirs._M_refcount._M_pi = local_c8._M_dirs._M_refcount._M_pi;
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_c8._M_dirs._M_refcount._M_pi)->_M_use_count =
               (local_c8._M_dirs._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_c8._M_dirs._M_refcount._M_pi)->_M_use_count =
               (local_c8._M_dirs._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_88._M_dirs._M_ptr = (element_type *)0x0;
      local_88._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                (&local_88);
      local_60._M_dirs._M_ptr = local_c8._M_dirs._M_ptr;
      local_60._M_dirs._M_refcount._M_pi = local_c8._M_dirs._M_refcount._M_pi;
      if (local_c8._M_dirs._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_c8._M_dirs._M_refcount._M_pi)->_M_use_count =
               (local_c8._M_dirs._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_c8._M_dirs._M_refcount._M_pi)->_M_use_count =
               (local_c8._M_dirs._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_78._M_dirs._M_ptr = (element_type *)0x0;
      local_78._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                (&local_60);
      while (local_b8._M_dirs._M_refcount._M_pi != local_78._M_dirs._M_refcount._M_pi) {
        ppVar4 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                                   (&local_b8);
        cVar3 = *(char *)&ppVar4[1]._M_pathname._M_dataplus._M_p;
        if ((cVar3 == '\x03') || (cVar3 == '\0')) {
          cVar3 = std::filesystem::status(ppVar4);
        }
        if (cVar3 == '\x01') {
          pcVar2 = (ppVar4->_M_pathname)._M_dataplus._M_p;
          local_a8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,pcVar2,pcVar2 + (ppVar4->_M_pathname)._M_string_length);
          process_file(this,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != paVar1) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
        }
        std::filesystem::__cxx11::recursive_directory_iterator::operator++(&local_b8);
      }
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                (&local_78);
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                (&local_b8);
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                (&local_c8);
    }
  }
  std::filesystem::__cxx11::path::~path(&local_50);
  return;
}

Assistant:

void db_packer::process_folder(const std::string& path)
{
#ifdef WIN32
	if (!path.empty()) {
		for (std::vector<std::string>::iterator it = m_folders.begin(),
				end = m_folders.end(); it != end; ++it) {
			if (path.compare(0, it->size(), *it) == 0) {
				*it = path;
				goto found;
			}
		}
		m_folders.push_back(path);
	}
found:
	WIN32_FIND_DATAA info;
	HANDLE h = FindFirstFileA((m_root + path + '*').c_str(), &info);
	if (h == INVALID_HANDLE_VALUE)
		return;
	do {
		xr_strlwr(info.cFileName, sizeof(info.cFileName));
		if (info.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY) {
			if (std::strcmp(info.cFileName, ".") != 0 && std::strcmp(info.cFileName, "..") != 0)
				process_folder((path + info.cFileName) + '\\');
		} else {
			process_file(path + info.cFileName);
		}
	} while (FindNextFileA(h, &info));
	FindClose(h);
#else
	fs::path fullpath(m_root + path);

	if(!fs::exists(fullpath) || !fs::is_directory(fullpath))
		return;

	for(auto const& de: fs::recursive_directory_iterator(fullpath))
	{
		if(de.is_regular_file())
			process_file(de.path());
	}
#endif
}